

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O1

void __thiscall
QListWidget::setSelectionModel(QListWidget *this,QItemSelectionModel *selectionModel)

{
  void **ppvVar1;
  void *pvVar2;
  undefined4 *puVar3;
  long lVar4;
  unsigned_long __i0;
  long lVar5;
  void **ppvVar6;
  long in_FS_OFFSET;
  void **local_70;
  code *local_68;
  ImplFn local_60;
  code *local_58;
  undefined8 local_50;
  Connection local_48;
  QObject local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = *(long *)&(this->super_QListView).super_QAbstractItemView.super_QAbstractScrollArea.
                    super_QFrame.super_QWidget.field_0x8;
  lVar5 = 0;
  do {
    QObject::disconnect((Connection *)(lVar4 + 0x610 + lVar5));
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x10);
  QAbstractItemView::setSelectionModel((QAbstractItemView *)this,selectionModel);
  lVar5 = *(long *)(lVar4 + 800);
  if (((lVar5 != 0) && (*(int *)(lVar5 + 4) != 0)) && (*(long *)(lVar4 + 0x328) != 0)) {
    if ((lVar5 == 0) || (*(int *)(lVar5 + 4) == 0)) {
      local_70 = (void **)0x0;
    }
    else {
      local_70 = *(void ***)(lVar4 + 0x328);
    }
    local_58 = QItemSelectionModel::currentChanged;
    ppvVar6 = (void **)0x0;
    local_50 = 0;
    local_68 = QListWidgetPrivate::emitCurrentItemChanged;
    local_60 = (ImplFn)0x0;
    ppvVar1 = *(void ***)(lVar4 + 8);
    puVar3 = (undefined4 *)operator_new(0x20);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QListWidgetPrivate::*)(const_QModelIndex_&,_const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&,_const_QModelIndex_&>,_void>
         ::impl;
    *(code **)(puVar3 + 4) = QListWidgetPrivate::emitCurrentItemChanged;
    *(undefined8 *)(puVar3 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_48,local_70,(QObject *)&local_58,ppvVar1,
               (QSlotObjectBase *)&local_68,(ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
    if (*(long *)(lVar4 + 800) != 0) {
      if (*(int *)(*(long *)(lVar4 + 800) + 4) == 0) {
        ppvVar6 = (void **)0x0;
      }
      else {
        ppvVar6 = *(void ***)(lVar4 + 0x328);
      }
    }
    local_68 = itemSelectionChanged;
    lVar5 = 0;
    local_60 = (ImplFn)0x0;
    local_58 = QItemSelectionModel::selectionChanged;
    local_50 = 0;
    puVar3 = (undefined4 *)operator_new(0x20);
    *puVar3 = 1;
    *(code **)(puVar3 + 2) =
         QtPrivate::QCallableObject<void_(QListWidget::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar3 + 4) = itemSelectionChanged;
    *(undefined8 *)(puVar3 + 6) = 0;
    QObject::connectImpl
              (local_40,ppvVar6,(QObject *)&local_58,(void **)this,(QSlotObjectBase *)&local_68,
               (ConnectionType)puVar3,(int *)0x0,(QMetaObject *)0x0);
    do {
      pvVar2 = *(void **)(lVar4 + 0x610 + lVar5 * 8);
      *(void **)(lVar4 + 0x610 + lVar5 * 8) = (&local_48)[lVar5].d_ptr;
      (&local_48)[lVar5].d_ptr = pvVar2;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 2);
    lVar4 = 8;
    do {
      QMetaObject::Connection::~Connection((Connection *)((long)&local_48.d_ptr + lVar4));
      lVar4 = lVar4 + -8;
    } while (lVar4 != -8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListWidget::setSelectionModel(QItemSelectionModel *selectionModel)
{
    Q_D(QListWidget);

    for (const QMetaObject::Connection &connection : d->selectionModelConnections)
        disconnect(connection);

    QListView::setSelectionModel(selectionModel);

    if (d->selectionModel) {
        d->selectionModelConnections = {
            QObjectPrivate::connect(d->selectionModel, &QItemSelectionModel::currentChanged,
                                    d, &QListWidgetPrivate::emitCurrentItemChanged),
            QObject::connect(d->selectionModel, &QItemSelectionModel::selectionChanged,
                             this, &QListWidget::itemSelectionChanged)
        };
    }
}